

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_hdr_write(htsFile *hfp,bcf_hdr_t *h)

{
  htsExactFormat hVar1;
  BGZF *fp;
  int iVar2;
  undefined8 in_RAX;
  char *data;
  ssize_t sVar3;
  int hlen;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if (h->dirty != 0) {
    bcf_hdr_sync(h);
  }
  hVar1 = (hfp->format).format;
  if ((hVar1 != vcf) && (hVar1 != text_format)) {
    data = bcf_hdr_fmt_text(h,1,(int *)((long)&uStack_28 + 4));
    fp = (hfp->fp).bgzf;
    uStack_28._4_4_ = uStack_28._4_4_ + 1;
    sVar3 = bgzf_write(fp,"BCF\x02\x02",5);
    iVar2 = -1;
    if (sVar3 == 5) {
      sVar3 = bgzf_write(fp,(void *)((long)&uStack_28 + 4),4);
      if (sVar3 == 4) {
        sVar3 = bgzf_write(fp,data,(long)uStack_28._4_4_);
        if (sVar3 == uStack_28._4_4_) {
          free(data);
          iVar2 = 0;
        }
      }
    }
    return iVar2;
  }
  iVar2 = vcf_hdr_write(hfp,h);
  return iVar2;
}

Assistant:

int bcf_hdr_write(htsFile *hfp, bcf_hdr_t *h)
{
    if ( h->dirty ) bcf_hdr_sync(h);
    if (hfp->format.format == vcf || hfp->format.format == text_format)
        return vcf_hdr_write(hfp, h);

    int hlen;
    char *htxt = bcf_hdr_fmt_text(h, 1, &hlen);
    hlen++; // include the \0 byte

    BGZF *fp = hfp->fp.bgzf;
    if ( bgzf_write(fp, "BCF\2\2", 5) !=5 ) return -1;
    if ( bgzf_write(fp, &hlen, 4) !=4 ) return -1;
    if ( bgzf_write(fp, htxt, hlen) != hlen ) return -1;

    free(htxt);
    return 0;
}